

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO3Quad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO3Quad<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_> *this_00;
  long lVar6;
  Index index;
  ulong uVar7;
  ActualDstType actualDst;
  long lVar8;
  Matrix<double,_2,_4,_0,_2,_4> interior;
  Matrix<double,_2,_4,_0,_2,_4> vertices;
  Matrix<double,_2,_8,_0,_2,_8> midpoints;
  Matrix<double,_2,_16,_0,_2,_16> nodes;
  CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_> local_2c0;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  undefined1 local_268 [128];
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [136];
  double adStack_120 [32];
  
  local_2c0.m_xpr = (Matrix<double,_2,_16,_0,_2,_16> *)local_1e8;
  local_2c0.m_row = 0;
  local_2c0.m_col = 1;
  local_2c0.m_currentBlockRows = 1;
  local_1e8._0_8_ = 0.0;
  local_270 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&local_2c0,
                      &local_270);
  local_278 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_278);
  local_280 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_280);
  local_288 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_288);
  local_290 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_290);
  local_298 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_298);
  local_2a0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_(pCVar4,&local_2a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&local_2c0);
  local_2c0.m_xpr = (Matrix<double,_2,_16,_0,_2,_16> *)local_1a8;
  local_2c0.m_row = 0;
  local_2c0.m_col = 1;
  local_2c0.m_currentBlockRows = 1;
  local_1a8._0_8_ = 1.0;
  local_270 = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *)&local_2c0,
                      &local_270);
  local_278 = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_278);
  local_280 = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_280);
  local_288 = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_288);
  local_290 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_290);
  local_298 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_298);
  local_2a0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,&local_2a0);
  local_268._120_8_ = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x78));
  local_268._112_8_ = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x70));
  local_268._104_8_ = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x68));
  local_268._96_8_ = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x60));
  local_268._88_8_ = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x58));
  local_268._80_8_ = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x50));
  local_268._72_8_ = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar5,(Scalar *)(local_268 + 0x48));
  local_268._64_8_ = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
            (pCVar5,(Scalar *)(local_268 + 0x40));
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *)&local_2c0);
  local_2c0.m_xpr = (Matrix<double,_2,_16,_0,_2,_16> *)local_268;
  local_2c0.m_row = 0;
  local_2c0.m_col = 1;
  local_2c0.m_currentBlockRows = 1;
  local_268._0_8_ = 1.0;
  local_270 = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&local_2c0,
                      &local_270);
  local_278 = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_278);
  local_280 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_280);
  local_288 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_288);
  local_290 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_290);
  local_298 = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar4,&local_298);
  local_2a0 = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_(pCVar4,&local_2a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&local_2c0);
  local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.3333333333333333;
  local_1a8._8_8_ = (double)local_1a8._8_8_ * 0.3333333333333333;
  local_1a8._16_8_ = (double)local_1a8._16_8_ * 0.3333333333333333;
  local_1a8._24_8_ = (double)local_1a8._24_8_ * 0.3333333333333333;
  local_1a8._32_8_ = (double)local_1a8._32_8_ * 0.3333333333333333;
  local_1a8._40_8_ = (double)local_1a8._40_8_ * 0.3333333333333333;
  local_1a8._48_8_ = (double)local_1a8._48_8_ * 0.3333333333333333;
  local_1a8._56_8_ = (double)local_1a8._56_8_ * 0.3333333333333333;
  local_1a8._64_8_ = (double)local_1a8._64_8_ * 0.3333333333333333;
  local_1a8._72_8_ = (double)local_1a8._72_8_ * 0.3333333333333333;
  local_1a8._80_8_ = (double)local_1a8._80_8_ * 0.3333333333333333;
  local_1a8._88_8_ = (double)local_1a8._88_8_ * 0.3333333333333333;
  local_1a8._96_8_ = (double)local_1a8._96_8_ * 0.3333333333333333;
  local_1a8._104_8_ = (double)local_1a8._104_8_ * 0.3333333333333333;
  local_1a8._112_8_ = (double)local_1a8._112_8_ * 0.3333333333333333;
  local_1a8._120_8_ = (double)local_1a8._120_8_ * 0.3333333333333333;
  local_268._0_8_ = (double)local_268._0_8_ * 0.3333333333333333;
  local_268._8_8_ = (double)local_268._8_8_ * 0.3333333333333333;
  local_268._16_8_ = (double)local_268._16_8_ * 0.3333333333333333;
  local_268._24_8_ = (double)local_268._24_8_ * 0.3333333333333333;
  local_268._32_8_ = (double)local_268._32_8_ * 0.3333333333333333;
  local_268._40_8_ = (double)local_268._40_8_ * 0.3333333333333333;
  local_268._48_8_ = (double)local_268._48_8_ * 0.3333333333333333;
  local_268._56_8_ = (double)local_268._56_8_ * 0.3333333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>>::
  CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>
            ((CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>> *)&local_2c0,
             (Matrix<double,_2,_16,_0,_2,_16> *)(local_1a8 + 0x80),
             (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_1e8);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>> *)&local_2c0,
                       (DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *)local_1a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>> *)this_00,
             (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_268);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_>::finished(&local_2c0);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0x20,2,0x10);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,16,0,2,16>,double,double>
            (__return_storage_ptr__,(Matrix<double,_2,_16,_0,_2,_16> *)(local_1a8 + 0x80),
             (assign_op<double,_double> *)&local_2c0);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  uVar7 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar6) {
    lVar8 = 0;
    do {
      dVar3 = adStack_120[lVar8];
      pdVar1 = pdVar2 + lVar8;
      *pdVar1 = adStack_120[lVar8 + -1];
      pdVar1[1] = dVar3;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < lVar6) {
    do {
      pdVar2[uVar7] = adStack_120[uVar7 - 1];
      uVar7 = uVar7 + 1;
    } while (lVar6 - uVar7 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 16> nodes;

    Eigen::Matrix<double, 2, 4> vertices;
    Eigen::Matrix<double, 2, 8> midpoints;
    Eigen::Matrix<double, 2, 4> interior;

    // clang-format off
    vertices << 0.0, 1.0, 1.0, 0.0,
                0.0, 0.0, 1.0, 1.0;
    midpoints << 1.0, 2.0, 3.0, 3.0, 2.0, 1.0, 0.0, 0.0,
                 0.0, 0.0, 1.0, 2.0, 3.0, 3.0, 2.0, 1.0;
    interior << 1.0, 2.0, 2.0, 1.0,
                1.0, 1.0, 2.0, 2.0;
    // clang-format on
    midpoints *= 1.0 / 3.0;
    interior *= 1.0 / 3.0;

    nodes << vertices, midpoints, interior;

    return nodes;
  }